

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

uint32_t __thiscall
cppnet::BufferQueue::GetFreeMemoryBlock
          (BufferQueue *this,vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *block_vec,
          uint32_t size)

{
  element_type *peVar1;
  element_type *peVar2;
  uint uVar3;
  uint32_t mem_len_2;
  uint32_t mem_len_1;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_68;
  shared_ptr<cppnet::BufferBlock> temp;
  void *mem_2;
  void *mem_1;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *local_38;
  
  mem_1 = (void *)0x0;
  mem_2 = (void *)0x0;
  mem_len_1 = 0;
  mem_len_2 = 0;
  std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::reserve(block_vec,8);
  std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,
             &(this->_buffer_write).
              super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
  if (size == 0) {
    if (temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])(this);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,
                 &(this->_buffer_list)._tail.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,&local_68
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    }
    uVar3 = 0;
    while (temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (element_type *)0x0) {
      BufferBlock::GetFreeMemoryBlock
                (temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &mem_1,&mem_len_1,&mem_2,&mem_len_2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_1 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_68._M_ptr = (element_type *)mem_1;
        local_68._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_1;
        std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                  (block_vec,(Iovec *)&local_68);
        uVar3 = uVar3 + mem_len_1;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_2 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_68._M_ptr = (element_type *)mem_2;
        local_68._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_2;
        std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                  (block_vec,(Iovec *)&local_68);
        uVar3 = uVar3 + mem_len_2;
      }
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,
                 &(this->_buffer_list)._tail.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
      peVar2 = temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar1 = local_68._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      if (peVar2 == peVar1) break;
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,
                 &((temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_ListSlot<cppnet::BufferBlock>)._next.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,&local_68
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    }
  }
  else {
    local_38 = &(this->_buffer_list)._tail.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>;
    uVar3 = 0;
    while (uVar3 < size) {
      if (temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])(this);
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_68,local_38);
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,
                   &local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      }
      BufferBlock::GetFreeMemoryBlock
                (temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &mem_1,&mem_len_1,&mem_2,&mem_len_2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_1 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_68._M_ptr = (element_type *)mem_1;
        local_68._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_1;
        std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                  (block_vec,(Iovec *)&local_68);
        uVar3 = uVar3 + mem_len_1;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_2 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_68._M_ptr = (element_type *)mem_2;
        local_68._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)mem_len_2;
        std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::emplace_back<cppnet::Iovec>
                  (block_vec,(Iovec *)&local_68);
        uVar3 = uVar3 + mem_len_2;
      }
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,
                 &((temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_ListSlot<cppnet::BufferBlock>)._next.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,&local_68
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return uVar3;
}

Assistant:

uint32_t BufferQueue::GetFreeMemoryBlock(std::vector<Iovec>& block_vec, uint32_t size) {
    void* mem_1 = nullptr;
    void* mem_2 = nullptr;
    uint32_t mem_len_1 = 0;
    uint32_t mem_len_2 = 0;

    block_vec.reserve(__block_vec_default_size);
    std::shared_ptr<BufferBlock> temp = _buffer_write;
    uint32_t cur_len = 0;
    if (size > 0) {
        while (cur_len < size) {
            if (temp == nullptr) {
                Append();
                temp = _buffer_list.GetTail();
            }
        
            temp->GetFreeMemoryBlock(mem_1, mem_len_1, mem_2, mem_len_2);
            if (mem_len_1 > 0) {
                block_vec.emplace_back(Iovec(mem_1, mem_len_1));
                cur_len += mem_len_1;
            }
            if (mem_len_2 > 0) {
                block_vec.emplace_back(Iovec(mem_2, mem_len_2));
                cur_len += mem_len_2;
            }
            temp = temp->GetNext();
        }

    } else {
        // add one block
        if (!temp) {
            Append();
            temp = _buffer_list.GetTail();
        }
        
        while (temp) {
            temp->GetFreeMemoryBlock(mem_1, mem_len_1, mem_2, mem_len_2);
            if (mem_len_1 > 0) {
                block_vec.emplace_back(Iovec(mem_1, mem_len_1));
                cur_len += mem_len_1;
            }
            if (mem_len_2 > 0) {
                block_vec.emplace_back(Iovec(mem_2, mem_len_2));
                cur_len += mem_len_2;
            }
            if (temp == _buffer_list.GetTail()) {
                break;
            }
            temp = temp->GetNext();
        }
    }
    return cur_len;
}